

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

char * deqp::gls::BufferTestUtil::getBufferTargetName(deUint32 target)

{
  if (target == 0x8892) {
    return "array";
  }
  if (target == 0x8893) {
    return "element_array";
  }
  if (target == 0x88eb) {
    return "pixel_pack";
  }
  if (target == 0x88ec) {
    return "pixel_unpack";
  }
  if (target == 0x8a11) {
    return "uniform";
  }
  if (target == 0x8c2a) {
    return "texture";
  }
  if (target == 0x8c8e) {
    return "transform_feedback";
  }
  if (target != 0x8f37) {
    if (target == 0x8f36) {
      return "copy_read";
    }
    return (char *)0x0;
  }
  return "copy_write";
}

Assistant:

const char* getBufferTargetName (deUint32 target)
{
	switch (target)
	{
		case GL_ARRAY_BUFFER:				return "array";
		case GL_COPY_READ_BUFFER:			return "copy_read";
		case GL_COPY_WRITE_BUFFER:			return "copy_write";
		case GL_ELEMENT_ARRAY_BUFFER:		return "element_array";
		case GL_PIXEL_PACK_BUFFER:			return "pixel_pack";
		case GL_PIXEL_UNPACK_BUFFER:		return "pixel_unpack";
		case GL_TEXTURE_BUFFER:				return "texture";
		case GL_TRANSFORM_FEEDBACK_BUFFER:	return "transform_feedback";
		case GL_UNIFORM_BUFFER:				return "uniform";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}